

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

void subelems_deallocator(size_t count,yin_subelement *subelems)

{
  ly_stmt lVar1;
  void **ppvVar2;
  
  if (count != 0) {
    ppvVar2 = &subelems->dest;
    do {
      lVar1 = ((yin_subelement *)(ppvVar2 + -1))->type;
      if ((int)lVar1 < 0x200) {
        if ((((lVar1 - LY_STMT_NOTIFICATION < 0x40) &&
             ((0x800000008000808bU >> ((ulong)(lVar1 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
            (lVar1 == LY_STMT_AUGMENT)) || (lVar1 == LY_STMT_CASE)) goto LAB_001856f3;
        goto LAB_001856fb;
      }
      if ((int)lVar1 < 0x4000) {
        if ((int)lVar1 < 0x800) {
          if ((lVar1 == LY_STMT_CHOICE) || (lVar1 == LY_STMT_CONTAINER)) goto LAB_001856f3;
        }
        else if ((lVar1 == LY_STMT_GROUPING) ||
                ((lVar1 == LY_STMT_LEAF || (lVar1 == LY_STMT_LEAF_LIST)))) {
LAB_001856f3:
          free(*ppvVar2);
        }
      }
      else if ((int)lVar1 < 0x140000) {
        if ((lVar1 == LY_STMT_LIST) || (lVar1 == LY_STMT_USES)) goto LAB_001856f3;
      }
      else if ((lVar1 == LY_STMT_IMPORT) ||
              ((lVar1 == LY_STMT_TYPEDEF || (lVar1 == LY_STMT_INCLUDE)))) goto LAB_001856f3;
LAB_001856fb:
      ppvVar2 = ppvVar2 + 3;
      count = count - 1;
    } while (count != 0);
  }
  free(subelems);
  return;
}

Assistant:

static void
subelems_deallocator(size_t count, struct yin_subelement *subelems)
{
    for (size_t i = 0; i < count; ++i) {
        if (HAS_META(subelems[i].type)) {
            free(subelems[i].dest);
        }
    }

    free(subelems);
}